

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O1

SQInteger sqstd_rex_element(SQRex *exp)

{
  char *pcVar1;
  byte bVar2;
  byte *pbVar3;
  SQRexNode *pSVar4;
  bool bVar5;
  int iVar6;
  SQInteger c_1;
  SQInteger SVar7;
  SQInteger SVar8;
  long lVar9;
  SQInteger SVar10;
  SQChar **ppSVar11;
  uint uVar12;
  char *pcVar13;
  char cVar14;
  SQRexNodeType SVar15;
  ushort uVar16;
  SQInteger c;
  long lVar17;
  uint uVar18;
  
  pbVar3 = (byte *)exp->_p;
  bVar2 = *pbVar3;
  if (0x2d < bVar2) {
    if (bVar2 == 0x2e) {
      exp->_p = (SQChar *)(pbVar3 + 1);
      SVar15 = 0x104;
      goto LAB_001083bd;
    }
    if (bVar2 != 0x5b) goto LAB_00108391;
    exp->_p = (SQChar *)(pbVar3 + 1);
    if (pbVar3[1] == 0x5e) {
      SVar7 = sqstd_rex_newnode(exp,0x107);
      exp->_p = exp->_p + 1;
    }
    else {
      SVar7 = sqstd_rex_newnode(exp,0x105);
    }
    pcVar13 = exp->_p;
    cVar14 = *pcVar13;
    if (cVar14 != ']') {
      lVar17 = -1;
      SVar8 = SVar7;
      do {
        lVar9 = lVar17;
        if (pcVar13 == exp->_eol) break;
        if (lVar17 == -1 || cVar14 != '-') {
          if (lVar17 == -1) {
            lVar9 = sqstd_rex_charnode(exp,1);
          }
          else {
            exp->_nodes[SVar8].next = lVar17;
            lVar9 = sqstd_rex_charnode(exp,1);
            SVar8 = lVar17;
          }
        }
        else {
          exp->_p = pcVar13 + 1;
          if (*pcVar13 == ']') {
            ppSVar11 = exp->_error;
            if (ppSVar11 == (SQChar **)0x0) goto LAB_0010875b;
            pcVar13 = "unfinished range";
            goto LAB_00108758;
          }
          SVar10 = sqstd_rex_newnode(exp,0x108);
          pcVar13 = exp->_p;
          pSVar4 = exp->_nodes;
          iVar6 = pSVar4[lVar17].type;
          if (*pcVar13 < iVar6) {
            ppSVar11 = exp->_error;
            if (ppSVar11 == (SQChar **)0x0) goto LAB_0010875b;
            pcVar13 = "invalid range";
            goto LAB_00108758;
          }
          if (iVar6 == 0x106) {
            ppSVar11 = exp->_error;
            if (ppSVar11 == (SQChar **)0x0) goto LAB_0010875b;
            pcVar13 = "cannot use character classes in ranges";
            goto LAB_00108758;
          }
          pSVar4[SVar10].left = (long)iVar6;
          if (*pcVar13 == 0x5c) {
            pcVar1 = pcVar13 + 1;
            exp->_p = pcVar1;
            uVar18 = (int)pcVar13[1] - 0x66U >> 1;
            uVar12 = uVar18 | (uint)(((int)pcVar13[1] - 0x66U & 1) != 0) << 0x1f;
            exp->_p = pcVar13 + 2;
            pcVar13 = pcVar1;
            if ((uVar12 < 9) && ((0x1d1U >> (uVar18 & 0x1f) & 1) != 0)) {
              pcVar13 = &DAT_0010b5bc + uVar12;
            }
          }
          else {
            iVar6 = isprint((int)*pcVar13);
            if (iVar6 == 0) {
              ppSVar11 = exp->_error;
              if (ppSVar11 == (SQChar **)0x0) goto LAB_0010875b;
              pcVar13 = "letter expected";
              goto LAB_00108758;
            }
            exp->_p = pcVar13 + 1;
          }
          pSVar4[SVar10].right = (long)*pcVar13;
          pSVar4[SVar8].next = SVar10;
          lVar9 = -1;
          SVar8 = SVar10;
        }
        pcVar13 = exp->_p;
        cVar14 = *pcVar13;
        lVar17 = lVar9;
      } while (cVar14 != ']');
      if (lVar9 != -1) {
        exp->_nodes[SVar8].next = lVar9;
      }
      pSVar4 = exp->_nodes;
      pSVar4[SVar7].left = pSVar4[SVar7].next;
      pSVar4[SVar7].next = -1;
      SVar8 = 0x5d;
      goto LAB_00108565;
    }
    ppSVar11 = exp->_error;
    if (ppSVar11 == (SQChar **)0x0) goto LAB_0010875b;
    pcVar13 = "empty class";
    goto LAB_00108758;
  }
  if (bVar2 == 0x24) {
    exp->_p = (SQChar *)(pbVar3 + 1);
    SVar15 = 0x10a;
LAB_001083bd:
    SVar7 = sqstd_rex_newnode(exp,SVar15);
  }
  else if (bVar2 == 0x28) {
    exp->_p = (SQChar *)(pbVar3 + 1);
    SVar15 = 0x102;
    if (pbVar3[1] == 0x3f) {
      exp->_p = (SQChar *)(pbVar3 + 2);
      sqstd_rex_expect(exp,0x3a);
      SVar15 = 0x103;
    }
    SVar7 = sqstd_rex_newnode(exp,SVar15);
    SVar8 = sqstd_rex_list(exp);
    exp->_nodes[SVar7].left = SVar8;
    SVar8 = 0x29;
LAB_00108565:
    sqstd_rex_expect(exp,SVar8);
  }
  else {
LAB_00108391:
    SVar7 = sqstd_rex_charnode(exp,0);
  }
  pbVar3 = (byte *)exp->_p;
  bVar2 = *pbVar3;
  uVar18 = 0;
  bVar5 = true;
  if (bVar2 < 0x3f) {
    if (bVar2 == 0x2a) {
      exp->_p = (SQChar *)(pbVar3 + 1);
      uVar12 = 0xffff;
LAB_0010861e:
      bVar5 = false;
      uVar18 = 0;
      goto LAB_00108661;
    }
    uVar12 = 0;
    uVar18 = 0;
    if (bVar2 != 0x2b) goto LAB_00108661;
    exp->_p = (SQChar *)(pbVar3 + 1);
    uVar12 = 0xffff;
    uVar18 = 0x10000;
  }
  else {
    if (bVar2 == 0x3f) {
      exp->_p = (SQChar *)(pbVar3 + 1);
      uVar12 = 1;
      goto LAB_0010861e;
    }
    uVar12 = 0;
    if (bVar2 != 0x7b) goto LAB_00108661;
    exp->_p = (SQChar *)(pbVar3 + 1);
    if (9 < (int)(char)pbVar3[1] - 0x30U) {
      ppSVar11 = exp->_error;
      if (ppSVar11 == (SQChar **)0x0) goto LAB_0010875b;
      pcVar13 = "number expected";
LAB_00108758:
      *ppSVar11 = pcVar13;
LAB_0010875b:
      longjmp((__jmp_buf_tag *)exp->_jmpbuf,-1);
    }
    SVar8 = sqstd_rex_parsenumber(exp);
    pcVar13 = exp->_p;
    if (*pcVar13 == ',') {
      exp->_p = pcVar13 + 1;
      uVar16 = 0xffff;
      if ((int)pcVar13[1] - 0x30U < 10) {
        SVar10 = sqstd_rex_parsenumber(exp);
        uVar16 = (ushort)SVar10;
      }
      sqstd_rex_expect(exp,0x7d);
    }
    else {
      if (*pcVar13 != '}') {
        ppSVar11 = exp->_error;
        if (ppSVar11 == (SQChar **)0x0) goto LAB_0010875b;
        pcVar13 = ", or } expected";
        goto LAB_00108758;
      }
      exp->_p = pcVar13 + 1;
      uVar16 = (ushort)SVar8;
    }
    uVar18 = (int)SVar8 << 0x10;
    uVar12 = (uint)uVar16;
  }
  bVar5 = false;
LAB_00108661:
  SVar8 = SVar7;
  if (!bVar5) {
    SVar8 = sqstd_rex_newnode(exp,0x100);
    pSVar4 = exp->_nodes;
    pSVar4[SVar8].left = SVar7;
    pSVar4[SVar8].right = (long)(int)(uVar12 | uVar18);
  }
  bVar2 = *exp->_p;
  if (((0x2b < (ulong)bVar2) || ((0xe0000000001U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) &&
     (bVar2 != 0x7c)) {
    SVar7 = sqstd_rex_element(exp);
    exp->_nodes[SVar8].next = SVar7;
  }
  return SVar8;
}

Assistant:

static SQInteger sqstd_rex_element(SQRex *exp)
{
    SQInteger ret = -1;
    switch(*exp->_p)
    {
    case '(': {
        SQInteger expr;
        exp->_p++;


        if(*exp->_p =='?') {
            exp->_p++;
            sqstd_rex_expect(exp,':');
            expr = sqstd_rex_newnode(exp,OP_NOCAPEXPR);
        }
        else
            expr = sqstd_rex_newnode(exp,OP_EXPR);
        SQInteger newn = sqstd_rex_list(exp);
        exp->_nodes[expr].left = newn;
        ret = expr;
        sqstd_rex_expect(exp,')');
              }
              break;
    case '[':
        exp->_p++;
        ret = sqstd_rex_class(exp);
        sqstd_rex_expect(exp,']');
        break;
    case SQREX_SYMBOL_END_OF_STRING: exp->_p++; ret = sqstd_rex_newnode(exp,OP_EOL);break;
    case SQREX_SYMBOL_ANY_CHAR: exp->_p++; ret = sqstd_rex_newnode(exp,OP_DOT);break;
    default:
        ret = sqstd_rex_charnode(exp,SQFalse);
        break;
    }


    SQBool isgreedy = SQFalse;
    unsigned short p0 = 0, p1 = 0;
    switch(*exp->_p){
        case SQREX_SYMBOL_GREEDY_ZERO_OR_MORE: p0 = 0; p1 = 0xFFFF; exp->_p++; isgreedy = SQTrue; break;
        case SQREX_SYMBOL_GREEDY_ONE_OR_MORE: p0 = 1; p1 = 0xFFFF; exp->_p++; isgreedy = SQTrue; break;
        case SQREX_SYMBOL_GREEDY_ZERO_OR_ONE: p0 = 0; p1 = 1; exp->_p++; isgreedy = SQTrue; break;
        case '{':
            exp->_p++;
            if(!isdigit(*exp->_p)) sqstd_rex_error(exp,_SC("number expected"));
            p0 = (unsigned short)sqstd_rex_parsenumber(exp);
            /*******************************/
            switch(*exp->_p) {
        case '}':
            p1 = p0; exp->_p++;
            break;
        case ',':
            exp->_p++;
            p1 = 0xFFFF;
            if(isdigit(*exp->_p)){
                p1 = (unsigned short)sqstd_rex_parsenumber(exp);
            }
            sqstd_rex_expect(exp,'}');
            break;
        default:
            sqstd_rex_error(exp,_SC(", or } expected"));
            }
            /*******************************/
            isgreedy = SQTrue;
            break;

    }
    if(isgreedy) {
        SQInteger nnode = sqstd_rex_newnode(exp,OP_GREEDY);
        exp->_nodes[nnode].left = ret;
        exp->_nodes[nnode].right = ((p0)<<16)|p1;
        ret = nnode;
    }

    if((*exp->_p != SQREX_SYMBOL_BRANCH) && (*exp->_p != ')') && (*exp->_p != SQREX_SYMBOL_GREEDY_ZERO_OR_MORE) && (*exp->_p != SQREX_SYMBOL_GREEDY_ONE_OR_MORE) && (*exp->_p != '\0')) {
        SQInteger nnode = sqstd_rex_element(exp);
        exp->_nodes[ret].next = nnode;
    }

    return ret;
}